

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_form_insert2_tet(REF_CAVITY ref_cavity,REF_INT faceid)

{
  REF_INT RVar1;
  REF_GRID pRVar2;
  REF_CELL ref_cell;
  REF_CELL pRVar3;
  REF_INT *pRVar4;
  REF_ADJ pRVar5;
  REF_INT RVar6;
  REF_INT RVar7;
  uint uVar8;
  REF_STATUS RVar9;
  REF_ADJ_ITEM pRVar10;
  undefined8 uVar11;
  long lVar12;
  char *pcVar13;
  REF_INT RVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  uint local_84;
  int local_80;
  REF_INT local_7c;
  REF_INT face_nodes [4];
  REF_BOOL reversed;
  REF_INT tet1;
  REF_INT tet0;
  REF_INT seg_nodes [3];
  
  pRVar2 = ref_cavity->ref_grid;
  RVar1 = ref_cavity->node;
  ref_cell = pRVar2->cell[8];
  lVar15 = 0;
  local_7c = faceid;
  while( true ) {
    if (ref_cavity->tri_list->n <= lVar15) break;
    pRVar3 = pRVar2->cell[3];
    pRVar4 = pRVar3->c2n;
    lVar12 = (long)pRVar3->size_per * (long)ref_cavity->tri_list->value[lVar15];
    face_nodes[0] = pRVar4[lVar12];
    face_nodes[1] = pRVar4[lVar12 + 1];
    face_nodes[2] = pRVar4[lVar12 + 2];
    face_nodes[3] = face_nodes[0];
    uVar8 = ref_cell_with_face(ref_cell,face_nodes,&tet0,&tet1);
    if (uVar8 != 0) {
      pcVar13 = "tet";
      uVar11 = 0x3fa;
LAB_001515e6:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar11,"ref_cavity_form_insert2_tet",(ulong)uVar8,pcVar13);
      return uVar8;
    }
    if (tet0 == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x3fb,"ref_cavity_form_insert2_tet","tet0 not found");
      return 1;
    }
    if ((long)tet1 != -1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x3fc,"ref_cavity_form_insert2_tet","tet1 found",0xffffffffffffffff,(long)tet1);
      return 1;
    }
    uVar8 = ref_cavity_add_tet_without_faceid(ref_cavity,tet0,local_7c);
    RVar7 = face_nodes[1];
    RVar6 = face_nodes[0];
    if (uVar8 != 0) {
      pcVar13 = "add interior tet face";
      uVar11 = 0x3fe;
      goto LAB_001515e6;
    }
    uVar18 = (ulong)(uint)face_nodes[0];
    seg_nodes[0] = face_nodes[0];
    seg_nodes[1] = face_nodes[1];
    uVar8 = ref_cavity_find_seg(ref_cavity,seg_nodes,&local_80,&reversed);
    if ((uVar8 != 0) && (uVar8 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x403,"ref_cavity_form_insert2_tet",(ulong)uVar8,"find existing");
      local_84 = uVar8;
    }
    if ((uVar8 != 5) && (uVar8 != 0)) {
      return local_84;
    }
    if (local_80 == -1) {
      RVar14 = -1;
      iVar16 = -1;
      if (RVar6 < 0) goto LAB_001512f2;
      pRVar5 = ref_cell->ref_adj;
      if (pRVar5->nnode <= RVar6) goto LAB_001512f2;
      iVar17 = pRVar5->first[uVar18];
      if (iVar17 == -1) goto LAB_001512f2;
      pRVar10 = pRVar5->item;
      do {
        RVar14 = pRVar10[iVar17].ref;
        iVar16 = iVar17;
LAB_001512f2:
        do {
          if (iVar16 == -1) goto LAB_0015110c;
          for (lVar12 = 0; (int)lVar12 < ref_cell->node_per; lVar12 = lVar12 + 1) {
            if ((RVar7 == ref_cell->c2n[(long)RVar14 * (long)ref_cell->size_per + lVar12]) &&
               (uVar8 = ref_cavity_add_tet_without_faceid(ref_cavity,RVar14,local_7c), uVar8 != 0))
            {
              uVar11 = 0x408;
              goto LAB_001514ba;
            }
          }
          pRVar10 = ref_cell->ref_adj->item;
          iVar17 = pRVar10[iVar16].next;
          RVar14 = -1;
          iVar16 = iVar17;
        } while (iVar17 == -1);
      } while( true );
    }
LAB_0015110c:
    RVar7 = face_nodes[2];
    RVar6 = face_nodes[1];
    uVar18 = (ulong)(uint)face_nodes[1];
    seg_nodes[0] = face_nodes[1];
    seg_nodes[1] = face_nodes[2];
    uVar8 = ref_cavity_find_seg(ref_cavity,seg_nodes,&local_80,&reversed);
    if ((uVar8 != 0) && (uVar8 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x40f,"ref_cavity_form_insert2_tet",(ulong)uVar8,"find existing");
      local_84 = uVar8;
    }
    if ((uVar8 != 5) && (uVar8 != 0)) {
      return local_84;
    }
    if (local_80 == -1) {
      RVar14 = -1;
      iVar16 = -1;
      if (RVar6 < 0) goto LAB_00151368;
      pRVar5 = ref_cell->ref_adj;
      if (pRVar5->nnode <= RVar6) goto LAB_00151368;
      iVar17 = pRVar5->first[uVar18];
      if (iVar17 == -1) goto LAB_00151368;
      pRVar10 = pRVar5->item;
      do {
        RVar14 = pRVar10[iVar17].ref;
        iVar16 = iVar17;
LAB_00151368:
        do {
          if (iVar16 == -1) goto LAB_0015118e;
          for (lVar12 = 0; (int)lVar12 < ref_cell->node_per; lVar12 = lVar12 + 1) {
            if ((RVar7 == ref_cell->c2n[(long)RVar14 * (long)ref_cell->size_per + lVar12]) &&
               (uVar8 = ref_cavity_add_tet_without_faceid(ref_cavity,RVar14,local_7c), uVar8 != 0))
            {
              uVar11 = 0x414;
              goto LAB_001514ba;
            }
          }
          pRVar10 = ref_cell->ref_adj->item;
          iVar17 = pRVar10[iVar16].next;
          RVar14 = -1;
          iVar16 = iVar17;
        } while (iVar17 == -1);
      } while( true );
    }
LAB_0015118e:
    RVar7 = face_nodes[2];
    RVar6 = face_nodes[0];
    uVar18 = (ulong)(uint)face_nodes[2];
    seg_nodes[0] = face_nodes[2];
    seg_nodes[1] = face_nodes[0];
    uVar8 = ref_cavity_find_seg(ref_cavity,seg_nodes,&local_80,&reversed);
    if ((uVar8 != 0) && (uVar8 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x41b,"ref_cavity_form_insert2_tet",(ulong)uVar8,"find existing");
      local_84 = uVar8;
    }
    if ((uVar8 != 5) && (uVar8 != 0)) {
      return local_84;
    }
    if (local_80 == -1) {
      RVar14 = -1;
      iVar16 = -1;
      if (RVar7 < 0) goto LAB_001513de;
      pRVar5 = ref_cell->ref_adj;
      if (pRVar5->nnode <= RVar7) goto LAB_001513de;
      iVar17 = pRVar5->first[uVar18];
      if (iVar17 == -1) goto LAB_001513de;
      pRVar10 = pRVar5->item;
      do {
        RVar14 = pRVar10[iVar17].ref;
        iVar16 = iVar17;
LAB_001513de:
        do {
          if (iVar16 == -1) goto LAB_00151210;
          for (lVar12 = 0; (int)lVar12 < ref_cell->node_per; lVar12 = lVar12 + 1) {
            if ((RVar6 == ref_cell->c2n[(long)RVar14 * (long)ref_cell->size_per + lVar12]) &&
               (uVar8 = ref_cavity_add_tet_without_faceid(ref_cavity,RVar14,local_7c), uVar8 != 0))
            {
              uVar11 = 0x420;
LAB_001514ba:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,uVar11,"ref_cavity_form_insert2_tet",(ulong)uVar8,"add interior tet face");
              return uVar8;
            }
          }
          pRVar10 = ref_cell->ref_adj->item;
          iVar17 = pRVar10[iVar16].next;
          RVar14 = -1;
          iVar16 = iVar17;
        } while (iVar17 == -1);
      } while( true );
    }
LAB_00151210:
    lVar15 = lVar15 + 1;
  }
  lVar15 = 4;
  lVar12 = 0;
  do {
    if (ref_cavity->maxseg <= lVar12) {
      if ((ref_cavity->debug != 0) &&
         (ref_cavity_tec(ref_cavity,"form-tet.tec"), ref_cavity->debug != 0)) {
        printf("insert face form state %d\n",(ulong)ref_cavity->state);
      }
      RVar9 = ref_cavity_verify_face_manifold(ref_cavity);
      if (RVar9 == 0) {
        if (ref_cavity->debug == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = 0;
          printf("insert face manifold state %d\n",(ulong)ref_cavity->state);
        }
      }
      else {
        pcVar13 = "ball face manifold";
        uVar8 = 1;
        uVar11 = 0x430;
LAB_0015167a:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar11,"ref_cavity_form_insert2_tet",(ulong)uVar8,pcVar13);
      }
      return uVar8;
    }
    iVar16 = *(int *)((long)ref_cavity->s2n + lVar15 + -4);
    if (iVar16 != -1) {
      face_nodes[1] = *(REF_INT *)((long)ref_cavity->s2n + lVar15);
      face_nodes[0] = iVar16;
      face_nodes[2] = RVar1;
      uVar8 = ref_cavity_insert_face(ref_cavity,face_nodes);
      if (uVar8 != 0) {
        pcVar13 = "tet side";
        uVar11 = 0x429;
        goto LAB_0015167a;
      }
    }
    lVar12 = lVar12 + 1;
    lVar15 = lVar15 + 0xc;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert2_tet(REF_CAVITY ref_cavity,
                                               REF_INT faceid) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_CELL ref_cell;
  REF_INT item;
  REF_INT face_nodes[4], seg_nodes[3], seg;
  /* add tets off wall from seg */
  ref_cell = ref_grid_tet(ref_grid);
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    REF_INT tet0, tet1, tet, cell_item, cell_node;
    REF_INT tri;
    REF_BOOL reversed;
    tri = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    face_nodes[0] = ref_cell_c2n(ref_grid_tri(ref_grid), 0, tri);
    face_nodes[1] = ref_cell_c2n(ref_grid_tri(ref_grid), 1, tri);
    face_nodes[2] = ref_cell_c2n(ref_grid_tri(ref_grid), 2, tri);
    face_nodes[3] = face_nodes[0];
    RSS(ref_cell_with_face(ref_cell, face_nodes, &tet0, &tet1), "tet");
    RUS(REF_EMPTY, tet0, "tet0 not found");
    REIS(REF_EMPTY, tet1, "tet1 found");
    RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet0, faceid),
        "add interior tet face");

    seg_nodes[0] = face_nodes[0];
    seg_nodes[1] = face_nodes[1];
    RXS(ref_cavity_find_seg(ref_cavity, seg_nodes, &seg, &reversed),
        REF_NOT_FOUND, "find existing");
    if (REF_EMPTY == seg) {
      each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1],
                                 cell_item, cell_node, tet) {
        RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet, faceid),
            "add interior tet face");
      }
    }

    seg_nodes[0] = face_nodes[1];
    seg_nodes[1] = face_nodes[2];
    RXS(ref_cavity_find_seg(ref_cavity, seg_nodes, &seg, &reversed),
        REF_NOT_FOUND, "find existing");
    if (REF_EMPTY == seg) {
      each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1],
                                 cell_item, cell_node, tet) {
        RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet, faceid),
            "add interior tet face");
      }
    }

    seg_nodes[0] = face_nodes[2];
    seg_nodes[1] = face_nodes[0];
    RXS(ref_cavity_find_seg(ref_cavity, seg_nodes, &seg, &reversed),
        REF_NOT_FOUND, "find existing");
    if (REF_EMPTY == seg) {
      each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1],
                                 cell_item, cell_node, tet) {
        RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet, faceid),
            "add interior tet face");
      }
    }
  }

  each_ref_cavity_valid_seg(ref_cavity, seg) {
    face_nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
    face_nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
    face_nodes[2] = node;
    RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
  }

  if (ref_cavity_debug(ref_cavity)) ref_cavity_tec(ref_cavity, "form-tet.tec");

  if (ref_cavity_debug(ref_cavity))
    printf("insert face form state %d\n", (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert face manifold state %d\n",
           (int)ref_cavity_state(ref_cavity));

  return REF_SUCCESS;
}